

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::add_file_to_generate
          (CodeGeneratorRequest *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  pbVar1 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add(&this->file_to_generate_);
  std::__cxx11::string::_M_assign((string *)pbVar1);
  return;
}

Assistant:

inline void CodeGeneratorRequest::add_file_to_generate(const std::string& value) {
  file_to_generate_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:google.protobuf.compiler.CodeGeneratorRequest.file_to_generate)
}